

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__create_png_image
              (stbi__png *a,stbi_uc *image_data,stbi__uint32 image_data_len,int out_n,int depth,
              int color,int interlaced)

{
  int iVar1;
  uint x_00;
  uint y_00;
  uint uVar2;
  int iVar3;
  stbi_uc *__ptr;
  int out_x;
  int out_y;
  stbi__uint32 img_len;
  int y;
  int x;
  int j;
  int i;
  int yspc [7];
  int xspc [7];
  int yorig [7];
  int xorig [7];
  int local_44;
  int p;
  stbi_uc *final;
  int out_bytes;
  int bytes;
  int color_local;
  int depth_local;
  int out_n_local;
  stbi__uint32 image_data_len_local;
  stbi_uc *image_data_local;
  stbi__png *a_local;
  
  iVar1 = 1;
  if (depth == 0x10) {
    iVar1 = 2;
  }
  iVar1 = out_n * iVar1;
  if (interlaced == 0) {
    a_local._4_4_ =
         stbi__create_png_image_raw
                   (a,image_data,image_data_len,out_n,a->s->img_x,a->s->img_y,depth,color);
  }
  else {
    __ptr = (stbi_uc *)stbi__malloc_mad3(a->s->img_x,a->s->img_y,iVar1,0);
    depth_local = image_data_len;
    _out_n_local = image_data;
    for (local_44 = 0; local_44 < 7; local_44 = local_44 + 1) {
      stack0xffffffffffffff98 = 0x400000000;
      stack0xffffffffffffff78 = 0;
      yorig[0] = 4;
      yorig[1] = 0;
      yorig[2] = 2;
      yorig[3] = 0;
      yorig[4] = 1;
      stack0xffffffffffffff58 = 0x800000008;
      xspc[0] = 4;
      xspc[1] = 4;
      xspc[2] = 2;
      xspc[3] = 2;
      xspc[4] = 1;
      _j = 0x800000008;
      yspc[0] = 8;
      yspc[1] = 4;
      yspc[2] = 4;
      yspc[3] = 2;
      yspc[4] = 2;
      x_00 = (((a->s->img_x - yorig[(long)local_44 + 6]) + yspc[(long)local_44 + 6]) - 1) /
             (uint)yspc[(long)local_44 + 6];
      y_00 = (((a->s->img_y - xspc[(long)local_44 + 6]) + (&j)[local_44]) - 1) /
             (uint)(&j)[local_44];
      if ((x_00 != 0) && (y_00 != 0)) {
        uVar2 = (((int)(a->s->img_n * x_00 * depth + 7) >> 3) + 1) * y_00;
        iVar3 = stbi__create_png_image_raw(a,_out_n_local,depth_local,out_n,x_00,y_00,depth,color);
        if (iVar3 == 0) {
          free(__ptr);
          return 0;
        }
        for (y = 0; y < (int)y_00; y = y + 1) {
          for (x = 0; x < (int)x_00; x = x + 1) {
            memcpy(__ptr + (long)((x * yspc[(long)local_44 + 6] + yorig[(long)local_44 + 6]) * iVar1
                                 ) + (ulong)((y * (&j)[local_44] + xspc[(long)local_44 + 6]) *
                                             a->s->img_x * iVar1),
                   a->out + (int)((y * x_00 + x) * iVar1),(long)iVar1);
          }
        }
        free(a->out);
        _out_n_local = _out_n_local + uVar2;
        depth_local = depth_local - uVar2;
      }
    }
    a->out = __ptr;
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

static int
stbi__create_png_image(stbi__png *a, stbi_uc *image_data, stbi__uint32 image_data_len, int out_n, int depth, int color,
                       int interlaced)
{
    int bytes = (depth == 16 ? 2 : 1);
    int out_bytes = out_n * bytes;
    stbi_uc *final;
    int p;
    if (!interlaced)
        return stbi__create_png_image_raw(a, image_data, image_data_len, out_n, a->s->img_x, a->s->img_y, depth, color);

    // de-interlacing
    final = (stbi_uc *) stbi__malloc_mad3(a->s->img_x, a->s->img_y, out_bytes, 0);
    for (p = 0; p < 7; ++p)
    {
        int xorig[] = {0, 4, 0, 2, 0, 1, 0};
        int yorig[] = {0, 0, 4, 0, 2, 0, 1};
        int xspc[] = {8, 8, 4, 4, 2, 2, 1};
        int yspc[] = {8, 8, 8, 4, 4, 2, 2};
        int i, j, x, y;
        // pass1_x[4] = 0, pass1_x[5] = 1, pass1_x[12] = 1
        x = (a->s->img_x - xorig[p] + xspc[p] - 1) / xspc[p];
        y = (a->s->img_y - yorig[p] + yspc[p] - 1) / yspc[p];
        if (x && y)
        {
            stbi__uint32 img_len = ((((a->s->img_n * x * depth) + 7) >> 3) + 1) * y;
            if (!stbi__create_png_image_raw(a, image_data, image_data_len, out_n, x, y, depth, color))
            {
                STBI_FREE(final);
                return 0;
            }
            for (j = 0; j < y; ++j)
            {
                for (i = 0; i < x; ++i)
                {
                    int out_y = j * yspc[p] + yorig[p];
                    int out_x = i * xspc[p] + xorig[p];
                    memcpy(final + out_y * a->s->img_x * out_bytes + out_x * out_bytes,
                           a->out + (j * x + i) * out_bytes, out_bytes);
                }
            }
            STBI_FREE(a->out);
            image_data += img_len;
            image_data_len -= img_len;
        }
    }
    a->out = final;

    return 1;
}